

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_strcasecmp(char *s1,char *s2)

{
  byte *pbVar1;
  long lVar2;
  u_char *us2;
  u_char *us1;
  
  lVar2 = 0;
  do {
    pbVar1 = (byte *)(s1 + lVar2);
    if (""[*pbVar1] != ""[(byte)s2[lVar2]]) {
      return (uint)""[*pbVar1] - (uint)""[(byte)s2[lVar2]];
    }
    lVar2 = lVar2 + 1;
  } while (*pbVar1 != 0);
  return 0;
}

Assistant:

int
pcap_strcasecmp(const char *s1, const char *s2)
{
	register const u_char	*cm = charmap,
				*us1 = (const u_char *)s1,
				*us2 = (const u_char *)s2;

	while (cm[*us1] == cm[*us2++])
		if (*us1++ == '\0')
			return(0);
	return (cm[*us1] - cm[*--us2]);
}